

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::affine_transform(tensor *dest,tensor *src,float A,float B)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  ostream *poVar6;
  string *a;
  undefined8 uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  tensor *in_RSI;
  tensor *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  size_t i;
  float *s;
  float *d;
  ostringstream dlib_o_out;
  error_type t;
  ulong local_1e0;
  ostream local_190;
  float local_18;
  float local_14;
  tensor *local_10;
  tensor *local_8;
  
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar3 = tensor::size(in_RDI);
  sVar4 = tensor::size(local_10);
  if (sVar3 != sVar4) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    poVar5 = std::operator<<(&local_190,"\n\nError detected at line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x19f);
    std::operator<<(poVar5,".\n");
    poVar5 = std::operator<<(&local_190,"Error detected in file ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar5,".\n");
    poVar5 = std::operator<<(&local_190,"Error detected in function ");
    poVar5 = std::operator<<(poVar5,
                             "void dlib::cpu::affine_transform(tensor &, const tensor &, const float, const float)"
                            );
    std::operator<<(poVar5,".\n\n");
    poVar5 = std::operator<<(&local_190,"Failing expression was ");
    poVar5 = std::operator<<(poVar5,"dest.size()==src.size()");
    std::operator<<(poVar5,".\n");
    poVar6 = (ostream *)std::ostream::operator<<(&local_190,std::boolalpha);
    a = (string *)std::operator<<(poVar6,"");
    t = (error_type)((ulong)poVar6 >> 0x20);
    std::operator<<((ostream *)a,"\n");
    uVar7 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar5,t,a);
    __cxa_throw(uVar7,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  iVar1 = (*local_8->_vptr_tensor[3])();
  iVar2 = (*local_10->_vptr_tensor[2])();
  local_1e0 = 0;
  while( true ) {
    sVar3 = tensor::size(local_10);
    if (sVar3 <= local_1e0) break;
    *(float *)(CONCAT44(extraout_var,iVar1) + local_1e0 * 4) =
         local_14 * *(float *)(CONCAT44(extraout_var_00,iVar2) + local_1e0 * 4) + local_18;
    local_1e0 = local_1e0 + 1;
  }
  return;
}

Assistant:

void affine_transform(
            tensor& dest,
            const tensor& src,
            const float A,
            const float B
        )
        {
            DLIB_CASSERT(dest.size()==src.size());
            const auto d = dest.host();
            const auto s = src.host();
            for (size_t i = 0; i < src.size(); ++i)
                d[i] = A*s[i] + B;
        }